

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O3

Node * __thiscall
uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::getNode
          (HttpRouter<uWS::HttpContextData<false>::RouterData> *this,Node *parent,string *child,
          bool isHighPriority)

{
  pointer puVar1;
  size_t __n;
  Node *pNVar2;
  pointer pcVar3;
  int iVar4;
  tuple<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  tVar5;
  __normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_*,_std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>_>
  __position;
  iterator iVar6;
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  *node;
  pointer puVar7;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]incppect_third_party_uWebSockets_src_HttpRouter_h:77:117)>
  __comp;
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  newNode;
  __uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  local_40;
  HttpRouter<uWS::HttpContextData<false>::RouterData> *local_38;
  
  puVar7 = (parent->children).
           super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (parent->children).
           super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (puVar7 != puVar1) {
    __n = child->_M_string_length;
    do {
      pNVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
               ._M_t.
               super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
               .
               super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
               ._M_head_impl;
      if (((pNVar2->name)._M_string_length == __n) &&
         (((__n == 0 ||
           (iVar4 = bcmp((pNVar2->name)._M_dataplus._M_p,(child->_M_dataplus)._M_p,__n), iVar4 == 0)
           ) && (pNVar2->isHighPriority == isHighPriority)))) {
        return pNVar2;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  tVar5.
  super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  .super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                  )operator_new(0x58);
  *(string **)
   tVar5.
   super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
   .super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>.
   _M_head_impl =
       (string *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              .
              super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
              ._M_head_impl + 0x10);
  pcVar3 = (child->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             tVar5.
             super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
             .
             super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
             ._M_head_impl,pcVar3,pcVar3 + child->_M_string_length);
  *(undefined8 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
          .
          super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
          ._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
          .
          super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
          ._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
          .
          super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
          ._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
          .
          super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
          ._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
          .
          super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
          ._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
          .
          super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
          ._M_head_impl + 0x28) = 0;
  *(bool *)((long)tVar5.
                  super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                  .
                  super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
                  ._M_head_impl + 0x50) = isHighPriority;
  __comp._M_comp.this = (HttpRouter<uWS::HttpContextData<true>::RouterData> *)local_38;
  __comp._M_comp.parent = (Node *)parent;
  local_40._M_t.
  super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  .super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>.
  _M_head_impl = (tuple<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                  )(tuple<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                    )tVar5.
                     super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                     .
                     super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
                     ._M_head_impl;
  __position = std::
               __upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>>*,std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>>,std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>>>>>,std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>>,__gnu_cxx::__ops::_Val_comp_iter<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::getNode(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node*,std::__cxx11::string,bool)::_lambda(auto:1&,auto:2&)_1_>>
                         ((parent->children).
                          super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (parent->children).
                          super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                           *)&local_40,__comp);
  iVar6 = std::
          vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
          ::_M_insert_rval(&parent->children,(const_iterator)__position._M_current,
                           (value_type *)&local_40);
  pNVar2 = ((iVar6._M_current)->_M_t).
           super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
           ._M_t.
           super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
           .
           super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
           ._M_head_impl;
  std::
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  ::~unique_ptr((unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                 *)&local_40);
  return pNVar2;
}

Assistant:

Node *getNode(Node *parent, std::string child, bool isHighPriority) {
        for (std::unique_ptr<Node> &node : parent->children) {
            if (node->name == child && node->isHighPriority == isHighPriority) {
                return node.get();
            }
        }

        /* Insert sorted, but keep order if parent is root (we sort methods by priority elsewhere) */
        std::unique_ptr<Node> newNode(new Node({child}));
        newNode->isHighPriority = isHighPriority;
        return parent->children.emplace(std::upper_bound(parent->children.begin(), parent->children.end(), newNode, [parent, this](auto &a, auto &b) {

            if (a->isHighPriority != b->isHighPriority) {
                return a->isHighPriority;
            }

            return b->name.length() && (parent != &root) && (b->name < a->name);
        }), std::move(newNode))->get();
    }